

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

Stretch ON_Font::FontStretchFromUnsigned(uint unsigned_font_stretch)

{
  if (9 < unsigned_font_stretch) {
    unsigned_font_stretch = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
               ,0x1af0,"","unsigned_font_stretch is not valid");
  }
  return (Stretch)unsigned_font_stretch;
}

Assistant:

ON_Font::Stretch ON_Font::FontStretchFromUnsigned(
  unsigned int unsigned_font_stretch
  )
{
  switch (unsigned_font_stretch)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Ultracondensed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Extracondensed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Condensed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Semicondensed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Medium);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Semiexpanded);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Expanded);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Extraexpanded);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Font::Stretch::Ultraexpanded);
  default:
    break;
  }
  ON_ERROR("unsigned_font_stretch is not valid");
  return ON_Font::Stretch::Unset;
}